

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shannon.c
# Opt level: O0

double inform_shannon_cross(inform_dist *p,inform_dist *q,double base)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint uVar3;
  _Bool _Var4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double v;
  double u;
  size_t i;
  double ce;
  double base_local;
  inform_dist *q_local;
  inform_dist *p_local;
  
  _Var4 = inform_dist_is_valid(p);
  if (((_Var4) && (_Var4 = inform_dist_is_valid(q), _Var4)) && (p->size == q->size)) {
    i = 0;
    for (u = 0.0; (ulong)u < p->size; u = (double)((long)u + 1)) {
      if ((p->histogram[(long)u] != 0) || (q->histogram[(long)u] != 0)) {
        uVar3 = p->histogram[(long)u];
        uVar1 = p->counts;
        auVar6._8_4_ = (int)(uVar1 >> 0x20);
        auVar6._0_8_ = uVar1;
        auVar6._12_4_ = 0x45300000;
        uVar2 = q->counts;
        auVar7._8_4_ = (int)(uVar2 >> 0x20);
        auVar7._0_8_ = uVar2;
        auVar7._12_4_ = 0x45300000;
        dVar5 = log2((double)q->histogram[(long)u] /
                     ((auVar7._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)));
        i = (size_t)(-((double)uVar3 /
                      ((auVar6._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0))) * dVar5 +
                    (double)i);
      }
    }
    dVar5 = log2(base);
    p_local = (inform_dist *)((double)i / dVar5);
  }
  else {
    p_local = (inform_dist *)0x7ff8000000000000;
  }
  return (double)p_local;
}

Assistant:

double inform_shannon_cross(inform_dist const *p, inform_dist const *q,
    double base)
{
    if (inform_dist_is_valid(p) && inform_dist_is_valid(q) && p->size == q->size)
    {
        double ce = 0.;
        for (size_t i = 0; i < p->size; ++i)
        {
            if (p->histogram[i] != 0 || q->histogram[i] != 0)
            {
                double u = (double) p->histogram[i] / p->counts;
                double v = (double) q->histogram[i] / q->counts;
                ce -= u * log2(v);
            }
        }
        return ce / log2(base);
    }
    return NAN;
}